

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  Input *this_00;
  char *pcVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  size_t size;
  ArrayPtr<const_char16_t> utf16;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Vector<char> decoded;
  ArrayPtr<const_char> stringValue;
  ArrayPtr<const_char> initalString;
  Array<char> local_48;
  
  this_00 = &this->input;
  Input::consume(this_00,'\"');
  pcVar1 = (this->input).wrapped.ptr;
  while (((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0'))) {
    cVar2 = Input::nextChar(this_00);
    if ((cVar2 == '\"') || (cVar2 == '\\')) break;
    Input::advance(this_00,1);
  }
  size = (long)(this_00->wrapped).ptr - (long)pcVar1;
  initalString.ptr = pcVar1;
  initalString.size_ = size;
  cVar2 = Input::nextChar(this_00);
  if (cVar2 == '\"') {
    Input::advance(this_00,1);
    kj::heapString(__return_storage_ptr__,pcVar1,size);
  }
  else {
    decoded.builder.endPtr = (char *)0x0;
    decoded.builder.ptr = (char *)0x0;
    decoded.builder.pos = (RemoveConst<char> *)0x0;
    decoded.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>(&decoded,&initalString);
    do {
      pcVar1 = (this_00->wrapped).ptr;
      while (((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0'))) {
        cVar2 = Input::nextChar(this_00);
        if ((cVar2 == '\"') || (cVar2 == '\\')) break;
        Input::advance(this_00,1);
      }
      stringValue.size_ = (long)(this_00->wrapped).ptr - (long)pcVar1;
      stringValue.ptr = pcVar1;
      kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>(&decoded,&stringValue);
      cVar2 = Input::nextChar(this_00);
      if (cVar2 == '\\') {
        Input::advance(this_00,1);
        bVar3 = Input::nextChar(this_00);
        if (bVar3 - 0x6e < 8) {
          switch((uint)bVar3) {
          case 0x6e:
            _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,10);
            kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
            break;
          default:
switchD_00168b2f_caseD_6f:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x31e,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                       (char (*) [31])"Invalid escape in JSON string.");
            kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
          case 0x72:
            _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,0xd);
            kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
            break;
          case 0x74:
            _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,9);
            kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
            break;
          case 0x75:
            Input::consume(this_00,'u');
            pcVar1 = (this_00->wrapped).ptr;
            Input::advance(this_00,4);
            _kjCondition.left = (long)(this_00->wrapped).ptr - (long)pcVar1;
            _kjCondition.right = 4;
            _kjCondition.op.content.ptr = " == ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = _kjCondition.left == 4;
            if (!_kjCondition.result) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                         ,0x345,FAILED,"hex.size() == 4","_kjCondition,",&_kjCondition);
              kj::_::Debug::Fault::fatal(&f);
            }
            uVar4 = 0;
            for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
              cVar2 = pcVar1[lVar5];
              f.exception._0_1_ = cVar2;
              iVar6 = -0x30;
              if (9 < (byte)(cVar2 - 0x30U)) {
                iVar6 = -0x57;
                if (5 < (byte)(cVar2 + 0x9fU)) {
                  iVar6 = -0x37;
                  if (5 < (byte)(cVar2 + 0xbfU)) {
                    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
                              ((Fault *)&_kjCondition,
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                               ,0x353,FAILED,(char *)0x0,
                               "\"Invalid hex digit in unicode escape.\", c",
                               (char (*) [37])"Invalid hex digit in unicode escape.",(char *)&f);
                    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
                  }
                }
              }
              uVar4 = uVar4 << 4 | iVar6 + cVar2;
            }
            if ((int)uVar4 < 0x80) {
              _kjCondition.left = (ulong)uVar4 & 0xffffffff0000007f;
              kj::Vector<char>::add<int>(&decoded,(int *)&_kjCondition);
            }
            else {
              f.exception._0_2_ = (undefined2)uVar4;
              utf16.size_ = 4;
              utf16.ptr = (char16_t *)0x1;
              kj::decodeUtf16((EncodingResult<kj::String> *)&_kjCondition,(kj *)&f,utf16);
              kj::Vector<char>::addAll<kj::EncodingResult<kj::String>>
                        (&decoded,(EncodingResult<kj::String> *)&_kjCondition);
              kj::Array<char>::~Array((Array<char> *)&_kjCondition);
            }
            goto LAB_00168c47;
          }
        }
        else if (bVar3 == 0x22) {
          _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,0x22);
          kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
        }
        else if (bVar3 == 0x2f) {
          _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,0x2f);
          kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
        }
        else if (bVar3 == 0x5c) {
          _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,0x5c);
          kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
        }
        else if (bVar3 == 0x62) {
          _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,8);
          kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
        }
        else {
          if (bVar3 != 0x66) goto switchD_00168b2f_caseD_6f;
          _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,0xc);
          kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
        }
        Input::advance(this_00,1);
      }
LAB_00168c47:
      cVar2 = Input::nextChar(this_00);
    } while (cVar2 != '\"');
    Input::consume(this_00,'\"');
    _kjCondition.left = _kjCondition.left & 0xffffffffffffff00;
    kj::Vector<char>::add<char>(&decoded,(char *)&_kjCondition);
    kj::Vector<char>::releaseAsArray(&local_48,&decoded);
    (__return_storage_ptr__->content).ptr = local_48.ptr;
    (__return_storage_ptr__->content).size_ = local_48.size_;
    (__return_storage_ptr__->content).disposer = local_48.disposer;
    local_48.ptr = (char *)0x0;
    local_48.size_ = 0;
    kj::Array<char>::~Array(&local_48);
    kj::ArrayBuilder<char>::dispose(&decoded.builder);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Get statistics on string size and preallocate?

    auto initalString = input.consumeWhile([](const char chr) {
        return chr != '"' && chr != '\\';
    });
    if (input.nextChar() == '"') {
      // optimization: Avoid allocating vector if no escapes encountered.
      input.advance();
      return kj::heapString(initalString.begin(), initalString.size());
    }

    kj::Vector<char> decoded;
    decoded.addAll(initalString);

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }